

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_schnorrsig_challenge
               (secp256k1_scalar *e,uchar *r32,uchar *msg,size_t msglen,uchar *pubkey32)

{
  uchar buf [32];
  secp256k1_sha256 sha;
  uchar auStack_b8 [40];
  secp256k1_sha256 local_90;
  
  local_90.s[0] = 0x9cecba11;
  local_90.s[1] = 0x23925381;
  local_90.s[2] = 0x11679112;
  local_90.s[3] = 0xd1627e0f;
  local_90.s[4] = 0x97c87550;
  local_90.s[5] = 0x3cc765;
  local_90.s[6] = 0x90f61164;
  local_90.s[7] = 0x33e9b66a;
  local_90.bytes = 0x40;
  secp256k1_sha256_write(&local_90,r32,0x20);
  secp256k1_sha256_write(&local_90,pubkey32,0x20);
  secp256k1_sha256_write(&local_90,msg,msglen);
  secp256k1_sha256_finalize(&local_90,auStack_b8);
  secp256k1_scalar_set_b32(e,auStack_b8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_schnorrsig_challenge(secp256k1_scalar* e, const unsigned char *r32, const unsigned char *msg, size_t msglen, const unsigned char *pubkey32)
{
    unsigned char buf[32];
    secp256k1_sha256 sha;

    /* tagged hash(r.x, pk.x, msg) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, r32, 32);
    secp256k1_sha256_write(&sha, pubkey32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, buf);
    /* Set scalar e to the challenge hash modulo the curve order as per
     * BIP340. */
    secp256k1_scalar_set_b32(e, buf, NULL);
}